

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::init
          (GeometryShaderRenderTest *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ContextType ctxType;
  int extraout_EAX;
  Surface *pSVar3;
  ReferenceContextBuffers *this_00;
  RenderTarget *pRVar4;
  RenderTarget *pRVar5;
  ReferenceContext *this_01;
  GLContext *this_02;
  NotSupportedError *this_03;
  ReferenceContextLimits limits;
  PixelBufferAccess local_118;
  ReferenceContextLimits local_f0;
  MultisamplePixelBufferAccess local_98;
  MultisamplePixelBufferAccess local_70;
  MultisamplePixelBufferAccess local_48;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader");
    if (!bVar2) {
      this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_03,"Tests require GL_EXT_geometry_shader extension or higher context version."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0x753);
      __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  paVar1 = &local_f0.extensionStr.field_2;
  local_f0.contextType.super_ApiType.m_bits = (ApiType)0x3;
  local_f0.maxTextureImageUnits = 0x10;
  local_f0.maxTexture2DSize = 0x800;
  local_f0.maxTextureCubeSize = 0x800;
  local_f0.maxTexture2DArrayLayers = 0x100;
  local_f0.maxTexture3DSize = 0x100;
  local_f0.maxRenderbufferSize = 0x800;
  local_f0.maxVertexAttribs = 0x10;
  local_f0.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0.extensionStr._M_string_length = 0;
  local_f0.extensionStr.field_2._M_local_buf[0] = '\0';
  local_f0.extensionStr._M_dataplus._M_p = (pointer)paVar1;
  pSVar3 = (Surface *)operator_new(0x18);
  tcu::Surface::Surface(pSVar3,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1]);
  this->m_glResult = pSVar3;
  pSVar3 = (Surface *)operator_new(0x18);
  tcu::Surface::Surface(pSVar3,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1]);
  this->m_refResult = pSVar3;
  this_00 = (ReferenceContextBuffers *)operator_new(0x78);
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (this_00,&pRVar4->m_pixelFormat,pRVar5->m_depthBits,0,(this->m_viewportSize).m_data[0],
             (this->m_viewportSize).m_data[1],1);
  this->m_refBuffers = this_00;
  this_01 = (ReferenceContext *)operator_new(0x61b0);
  tcu::TextureLevel::getAccess(&local_118,(TextureLevel *)this_00);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_118);
  tcu::TextureLevel::getAccess(&local_118,&this->m_refBuffers->m_depthbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_118);
  tcu::TextureLevel::getAccess(&local_118,&this->m_refBuffers->m_stencilbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_118);
  sglr::ReferenceContext::ReferenceContext(this_01,&local_f0,&local_48,&local_70,&local_98);
  this->m_refContext = this_01;
  this_02 = (GLContext *)operator_new(0x170);
  local_118.super_ConstPixelBufferAccess.m_size.m_data._0_8_ =
       *(undefined8 *)(this->m_viewportSize).m_data;
  local_118.super_ConstPixelBufferAccess.m_format.order = R;
  local_118.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  sglr::GLContext::GLContext
            (this_02,((this->super_TestCase).m_context)->m_renderCtx,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,3,
             (IVec4 *)&local_118);
  this->m_glContext = (Context *)this_02;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.extensionStr._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.extensionStr._M_dataplus._M_p,
                    CONCAT71(local_f0.extensionStr.field_2._M_allocated_capacity._1_7_,
                             local_f0.extensionStr.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0.extensionList);
  return extraout_EAX;
}

Assistant:

void GeometryShaderRenderTest::init (void)
{
	// requirements
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	// gen resources
	{
		sglr::ReferenceContextLimits limits;

		m_glResult		= new tcu::Surface(m_viewportSize.x(), m_viewportSize.y());
		m_refResult		= new tcu::Surface(m_viewportSize.x(), m_viewportSize.y());

		m_refBuffers	= new sglr::ReferenceContextBuffers(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, m_viewportSize.x(), m_viewportSize.y());
		m_refContext	= new sglr::ReferenceContext(limits, m_refBuffers->getColorbuffer(), m_refBuffers->getDepthbuffer(), m_refBuffers->getStencilbuffer());
		m_glContext		= new sglr::GLContext(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS | sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(0, 0, m_viewportSize.x(), m_viewportSize.y()));
	}
}